

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

void __thiscall BCLog::Logger::DisconnectTestLogger(Logger *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::mutex::lock((mutex *)this);
  this->m_buffering = true;
  if ((FILE *)this->m_fileout != (FILE *)0x0) {
    fclose((FILE *)this->m_fileout);
  }
  this->m_fileout = (FILE *)0x0;
  std::__cxx11::
  list<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
  ::clear(&this->m_print_callbacks);
  this->m_max_buffer_memusage = 1000000;
  this->m_cur_buffer_memusage = 0;
  this->m_buffer_lines_discarded = 0;
  std::__cxx11::list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>::clear
            (&this->m_msgs_before_open);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BCLog::Logger::DisconnectTestLogger()
{
    StdLockGuard scoped_lock(m_cs);
    m_buffering = true;
    if (m_fileout != nullptr) fclose(m_fileout);
    m_fileout = nullptr;
    m_print_callbacks.clear();
    m_max_buffer_memusage = DEFAULT_MAX_LOG_BUFFER;
    m_cur_buffer_memusage = 0;
    m_buffer_lines_discarded = 0;
    m_msgs_before_open.clear();
}